

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::tabletype<wasm::WATParser::ParseDefsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  bool bVar1;
  Lexer *pLVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Type local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  Type local_20;
  Type addressType;
  ParseDefsCtx *ctx_local;
  
  addressType.id = (uintptr_t)ctx;
  wasm::Type::Type(&local_20,i32);
  pLVar2 = (Lexer *)(addressType.id + 8);
  local_30 = sv("i64",3);
  bVar1 = Lexer::takeKeyword(pLVar2,local_30);
  if (bVar1) {
    wasm::Type::Type(&local_38,i64);
    local_20.id = local_38.id;
  }
  else {
    pLVar2 = (Lexer *)(addressType.id + 8);
    expected = sv("i32",3);
    Lexer::takeKeyword(pLVar2,expected);
  }
  tabletypeContinued<wasm::WATParser::ParseDefsCtx>
            (__return_storage_ptr__,(ParseDefsCtx *)addressType.id,local_20);
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TableTypeT> tabletype(Ctx& ctx) {
  Type addressType = Type::i32;
  if (ctx.in.takeKeyword("i64"sv)) {
    addressType = Type::i64;
  } else {
    ctx.in.takeKeyword("i32"sv);
  }
  return tabletypeContinued(ctx, addressType);
}